

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

int Dau_DsdDecomposeTripleVars(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  uint jVar;
  int iVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  char *pOut;
  abctime aVar5;
  word (*pawVar6) [64];
  int iVar7;
  ulong uVar8;
  byte bVar9;
  uint uSupports;
  uint uVar10;
  char *pcVar11;
  uint jVar_00;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  int u;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  bool bVar18;
  int nWords;
  char local_1132 [10];
  word pTtCof [2] [64];
  Dau_Dsd_t P1;
  
  aVar4 = Abc_Clock();
  pawVar6 = pTtCof + 1;
  pOut = P1.Cache[6] + 0x18;
  do {
    uVar16 = 0;
    if (0 < nVars) {
      uVar16 = nVars;
    }
    iVar7 = 1 << ((char)nVars - 6U & 0x1f);
    if (nVars < 7) {
      iVar7 = 1;
    }
    jVar_00 = nVars - 1;
    jVar = nVars - 2;
    uVar13 = (ulong)(uint)nVars;
    uVar12 = jVar_00;
    while (0 < (int)uVar13) {
      uVar14 = uVar13 - 1;
      bVar9 = 0;
      uVar10 = 0;
      for (uVar15 = 0; iVar1 = (int)uVar14, uVar16 != uVar15; uVar15 = uVar15 + 1) {
        if (uVar12 != uVar15) {
          iVar1 = Dau_DsdFindSupportOne(p,pTruth,pVars,nVars,iVar1,uVar15);
          uVar10 = uVar10 | iVar1 << (bVar9 & 0x1f);
        }
        bVar9 = bVar9 + 2;
      }
      if ((uVar10 & 0x55555555 & uVar10 >> 1) == 0) {
        P1.fSplitPrime = 0;
        P1.fWriteTruth = p->fWriteTruth;
        iVar2 = pVars[uVar14 & 0xffffffff];
        pVars[uVar14 & 0xffffffff] = pVars[(int)jVar_00];
        pVars[(int)jVar_00] = iVar2;
        Abc_TtSwapVars(pTruth,nVars,iVar1,jVar_00);
        Abc_TtCofactor0p(pTtCof[0],pTruth,iVar7,jVar_00);
        pawVar6 = pTtCof + 1;
        Abc_TtCofactor1p(*pawVar6,pTruth,iVar7,jVar_00);
        Dau_DsdWriteString(p,"<");
        Dau_DsdWriteVar(p,pVars[(int)jVar_00],0);
        Dau_DsdDecomposeInt(&P1,*pawVar6,jVar_00);
        Dau_DsdTranslate(p,pVars,jVar_00,P1.pOutput);
        p->nSizeNonDec = P1.nSizeNonDec;
        if (P1.nSizeNonDec != 0) {
          iVar7 = 1 << ((char)P1.nSizeNonDec - 6U & 0x1f);
          if (P1.nSizeNonDec < 7) {
            iVar7 = 1;
          }
          Abc_TtCopy(pTruth,*pawVar6,iVar7,0);
        }
        Dau_DsdDecomposeInt(&P1,pTtCof[0],jVar_00);
        Dau_DsdTranslate(p,pVars,jVar_00,P1.pOutput);
        Dau_DsdWriteString(p,">");
        iVar7 = p->nSizeNonDec;
        if (p->nSizeNonDec <= P1.nSizeNonDec) {
          iVar7 = P1.nSizeNonDec;
        }
        p->nSizeNonDec = iVar7;
        if (P1.nSizeNonDec != 0) {
          iVar7 = 1 << ((char)P1.nSizeNonDec - 6U & 0x1f);
          if (P1.nSizeNonDec < 7) {
            iVar7 = 1;
          }
          Abc_TtCopy(pTruth,pTtCof[0],iVar7,0);
        }
        return 0;
      }
      uVar15 = uVar10 & 0x55555555 & ~uVar10 >> 1;
      if ((uVar15 - 1 < (uVar15 ^ uVar15 - 1)) &&
         (uVar10 = ~uVar10 & uVar10 >> 1 & 0x55555555, uVar10 - 1 < (uVar10 ^ uVar10 - 1))) {
        iVar2 = Abc_TtSuppFindFirst(uVar15);
        iVar2 = iVar2 >> 1;
        iVar3 = Abc_TtSuppFindFirst(uVar10);
        iVar3 = iVar3 >> 1;
        Abc_TtCofactor0p(pTtCof[0],pTruth,iVar7,iVar1);
        Abc_TtCofactor1p(*pawVar6,pTruth,iVar7,iVar1);
        Abc_TtCofactor0p((word *)&P1,pTtCof[0],iVar7,iVar2);
        Abc_TtCofactor1p((word *)pOut,pTtCof[0],iVar7,iVar2);
        Abc_TtCofactor0p((word *)(P1.Cache[0x16] + 0x18),*pawVar6,iVar7,iVar3);
        pcVar11 = P1.pOutput + 0xd8;
        Abc_TtCofactor1p((word *)pcVar11,*pawVar6,iVar7,iVar3);
        iVar1 = Abc_TtEqual((word *)&P1,(word *)(P1.Cache[0x16] + 0x18),iVar7);
        if (iVar1 == 0) {
          bVar17 = false;
        }
        else {
          iVar1 = Abc_TtEqual((word *)pOut,(word *)pcVar11,iVar7);
          bVar17 = iVar1 != 0;
        }
        iVar1 = Abc_TtEqual((word *)&P1,(word *)pcVar11,iVar7);
        pcVar11 = P1.Cache[0x16] + 0x18;
        if (iVar1 == 0) {
          bVar18 = false;
        }
        else {
          iVar1 = Abc_TtEqual((word *)pOut,(word *)pcVar11,iVar7);
          bVar18 = iVar1 != 0;
        }
        if ((bool)(bVar17 | bVar18)) {
          iVar1 = pVars[iVar2];
          Dau_DsdTtElems();
          uVar8 = uVar14 & 0xffffffff;
          Abc_TtMux(pTruth,Dau_DsdTtElems::pTtElems[uVar8],(word *)(P1.pOutput + 0xd8),
                    (word *)pcVar11,iVar7);
          pcVar11 = "";
          if (bVar18) {
            pcVar11 = "!";
          }
          sprintf(local_1132,"<%c%c%s%c>",(ulong)(pVars[uVar8] + 0x61),(ulong)(pVars[iVar3] + 0x61),
                  pcVar11,(ulong)(pVars[iVar2] + 0x61));
          iVar2 = Dau_DsdAddVarDef(p,local_1132);
          pVars[uVar8] = iVar2;
          iVar2 = pVars[iVar3];
          pVars[iVar3] = pVars[(int)jVar_00];
          pVars[(int)jVar_00] = iVar2;
          Abc_TtSwapVars(pTruth,nVars,iVar3,jVar_00);
          iVar2 = Dau_DsdFindVarDef(pVars,jVar_00,iVar1);
          iVar1 = pVars[iVar2];
          pVars[iVar2] = pVars[(int)jVar];
          pVars[(int)jVar] = iVar1;
          Abc_TtSwapVars(pTruth,jVar_00,iVar2,jVar);
          iVar1 = Dau_DsdFindVarDef(pVars,jVar,p->nVarsUsed + -1);
          iVar1 = Dau_DsdDecomposeSingleVarOne(p,pTruth,pVars,jVar,iVar1);
          uVar10 = jVar;
          if ((iVar1 == 0) ||
             (uVar10 = Dau_DsdDecomposeSingleVar(p,pTruth,pVars,nVars - 3), uVar10 != nVars)) {
            if ((uVar10 == 0) ||
               (nVars = Dau_DsdDecomposeDoubleVars(p,pTruth,pVars,uVar10), nVars == 0)) {
              aVar5 = Abc_Clock();
              s_Times_2 = s_Times_2 + (aVar5 - aVar4);
              return 0;
            }
            break;
          }
        }
      }
      uVar12 = uVar12 - 1;
      uVar13 = uVar14;
    }
    if (uVar13 == 0) {
      aVar5 = Abc_Clock();
      s_Times_2 = s_Times_2 + (aVar5 - aVar4);
      return nVars;
    }
  } while( true );
}

Assistant:

int Dau_DsdDecomposeTripleVars( Dau_Dsd_t * p, word  * pTruth, int * pVars, int nVars )
{
    abctime clk = Abc_Clock();
    while ( 1 )
    {
        int v;
//        Kit_DsdPrintFromTruth( (unsigned *)pTruth, 6 ); printf( "\n" );
        for ( v = nVars - 1; v >= 0; v-- )
        {
            unsigned uSupports = Dau_DsdFindSupports( p, pTruth, pVars, nVars, v );
//            Dau_DsdPrintSupports( uSupports, nVars );
            if ( (uSupports & (uSupports >> 1) & 0x55555555) == 0 ) // non-overlapping supports
                return Dau_DsdDecomposeTripleVarsOuter( p, pTruth, pVars, nVars, v );
            if ( Abc_TtSuppOnlyOne( uSupports & (~uSupports >> 1) & 0x55555555) &&
                 Abc_TtSuppOnlyOne(~uSupports & ( uSupports >> 1) & 0x55555555) ) // one unique variable in each cofactor
            {
                int nVarsNew = Dau_DsdDecomposeTripleVarsInner( p, pTruth, pVars, nVars, v, uSupports );
                if ( nVarsNew == nVars )
                    continue;
                if ( nVarsNew == 0 )
                {
                    s_Times[2] += Abc_Clock() - clk;
                    return 0;
                }
                nVars = Dau_DsdDecomposeDoubleVars( p, pTruth, pVars, nVarsNew );
                if ( nVars == 0 )
                {
                    s_Times[2] += Abc_Clock() - clk;
                    return 0;
                }
                break;
            }
        }
        if ( v == -1 )
        {
            s_Times[2] += Abc_Clock() - clk;
            return nVars;
        }
    }
    assert( 0 );
    return -1;
}